

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O0

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::AppendDeviceData
          (ArchiverFactoryImpl *this,IDataBlob *pSrcArchive,ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
          IDataBlob *pDeviceArchive,IDataBlob **ppDstArchive)

{
  type DeviceFlag;
  DeviceType Dev;
  Char *pCVar1;
  DeviceType ArchiveDeviceType;
  type DataTypeFlag;
  Uint32 local_2c0;
  bool local_2bc;
  undefined1 local_2b8 [8];
  DeviceObjectArchive DevObjectArchive;
  undefined1 local_1b8 [8];
  DeviceObjectArchive ObjectArchive;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  IDataBlob **ppDstArchive_local;
  IDataBlob *pDeviceArchive_local;
  IDataBlob *pIStack_20;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags_local;
  IDataBlob *pSrcArchive_local;
  ArchiverFactoryImpl *this_local;
  
  msg.field_2._8_8_ = ppDstArchive;
  pDeviceArchive_local._4_4_ = DeviceFlags;
  pIStack_20 = pSrcArchive;
  pSrcArchive_local = (IDataBlob *)this;
  if (pSrcArchive == (IDataBlob *)0x0) {
    FormatString<char[29]>((string *)local_58,(char (*) [29])"pSrcArchive must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x102);
    std::__cxx11::string::~string((string *)local_58);
    this_local._7_1_ = 0;
  }
  else if (pDeviceArchive == (IDataBlob *)0x0) {
    FormatString<char[32]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [32])"pDeviceArchive must not be null"
              );
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x107);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    this_local._7_1_ = 0;
  }
  else if (ppDstArchive == (IDataBlob **)0x0) {
    FormatString<char[30]>
              ((string *)((long)&msg_3.field_2 + 8),(char (*) [30])"ppDstArchive must not be null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"AppendDeviceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x10c);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    this_local._7_1_ = 0;
  }
  else {
    if (*ppDstArchive != (IDataBlob *)0x0) {
      FormatString<char[27]>
                ((string *)&ObjectArchive.m_ContentVersion,
                 (char (*) [27])"*ppDstArchive must be null");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"AppendDeviceData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                 ,0x10f);
      std::__cxx11::string::~string((string *)&ObjectArchive.m_ContentVersion);
    }
    DevObjectArchive._232_8_ = pIStack_20;
    DeviceObjectArchive::DeviceObjectArchive
              ((DeviceObjectArchive *)local_1b8,(CreateInfo *)&DevObjectArchive.m_ContentVersion);
    local_2c0 = 0xffffffff;
    local_2bc = false;
    _ArchiveDeviceType = pDeviceArchive;
    DeviceObjectArchive::DeviceObjectArchive
              ((DeviceObjectArchive *)local_2b8,(CreateInfo *)&ArchiveDeviceType);
    while (pDeviceArchive_local._4_4_ != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
      DeviceFlag = ExtractLSB<Diligent::ARCHIVE_DEVICE_DATA_FLAGS>
                             ((ARCHIVE_DEVICE_DATA_FLAGS *)((long)&pDeviceArchive_local + 4));
      Dev = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceFlag);
      DeviceObjectArchive::AppendDeviceData
                ((DeviceObjectArchive *)local_1b8,(DeviceObjectArchive *)local_2b8,Dev);
    }
    DeviceObjectArchive::Serialize((DeviceObjectArchive *)local_1b8,(IDataBlob **)msg.field_2._8_8_)
    ;
    this_local._7_1_ = *(long *)msg.field_2._8_8_ != 0;
    DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)local_2b8);
    DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)local_1b8);
  }
  return (Bool)(this_local._7_1_ & 1);
}

Assistant:

Bool ArchiverFactoryImpl::AppendDeviceData(const IDataBlob*          pSrcArchive,
                                           ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags,
                                           const IDataBlob*          pDeviceArchive,
                                           IDataBlob**               ppDstArchive) const
{
    if (pSrcArchive == nullptr)
    {
        DEV_ERROR("pSrcArchive must not be null");
        return false;
    }
    if (pDeviceArchive == nullptr)
    {
        DEV_ERROR("pDeviceArchive must not be null");
        return false;
    }
    if (ppDstArchive == nullptr)
    {
        DEV_ERROR("ppDstArchive must not be null");
        return false;
    }
    DEV_CHECK_ERR(*ppDstArchive == nullptr, "*ppDstArchive must be null");

    try
    {
        DeviceObjectArchive       ObjectArchive{DeviceObjectArchive::CreateInfo{pSrcArchive}};
        const DeviceObjectArchive DevObjectArchive{DeviceObjectArchive::CreateInfo{pDeviceArchive}};

        while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
        {
            const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
            const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

            ObjectArchive.AppendDeviceData(DevObjectArchive, ArchiveDeviceType);
        }

        ObjectArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}